

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

Statement *
slang::ast::DoWhileLoopStatement::fromSyntax
          (Compilation *compilation,DoWhileStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DoWhileLoopStatement *stmt;
  SourceRange local_40;
  
  uVar1 = (stmtCtx->flags).m_bits;
  (stmtCtx->flags).m_bits = uVar1 | 1;
  iVar3 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  bVar2 = ASTContext::requireBooleanConvertible(context,(Expression *)CONCAT44(extraout_var,iVar3));
  iVar4 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::DoWhileLoopStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar3),
                    (Statement *)CONCAT44(extraout_var_00,iVar4),&local_40);
  if (!bVar2 || ((Statement *)CONCAT44(extraout_var_00,iVar4))->kind == Invalid) {
    stmt = (DoWhileLoopStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  (stmtCtx->flags).m_bits = uVar1 & 9 | (stmtCtx->flags).m_bits & 0x16;
  return &stmt->super_Statement;
}

Assistant:

Statement& DoWhileLoopStatement::fromSyntax(Compilation& compilation,
                                            const DoWhileStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    bool bad = false;
    auto& condExpr = Expression::bind(*syntax.expr, context);
    if (!context.requireBooleanConvertible(condExpr))
        bad = true;

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<DoWhileLoopStatement>(condExpr, bodyStmt,
                                                            syntax.sourceRange());

    if (bad || bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}